

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base_eval.cpp
# Opt level: O2

Vec3fa embree::avx::patchEval(SubdivPatch1Base *patch,float uu,float vv)

{
  undefined1 auVar1 [16];
  long in_RSI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar6 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar10 [64];
  float fVar11;
  float fVar13;
  float fVar14;
  undefined1 auVar12 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  Vec3fa VVar45;
  undefined8 uVar2;
  undefined8 uVar7;
  
  auVar10._4_60_ = in_register_00001244;
  auVar10._0_4_ = vv;
  uVar7 = auVar10._0_8_;
  auVar6._4_60_ = in_register_00001204;
  auVar6._0_4_ = uu;
  uVar2 = auVar6._0_8_;
  fVar11 = 0.0;
  fVar13 = 0.0;
  fVar14 = 0.0;
  fVar15 = 0.0;
  auVar5 = auVar6._0_16_;
  auVar3 = auVar10._0_16_;
  switch(*(undefined1 *)(in_RSI + 0x2d)) {
  case 1:
    fVar15 = 1.0 - vv;
    fVar11 = fVar15 * fVar15 * fVar15;
    fVar13 = vv * vv * vv;
    fVar14 = fVar15 * vv * fVar15;
    fVar15 = fVar15 * vv * vv;
    auVar5 = vshufps_avx(ZEXT416((uint)(fVar13 * 0.16666667)),ZEXT416((uint)(fVar13 * 0.16666667)),0
                        );
    fVar20 = auVar5._0_4_;
    fVar21 = auVar5._4_4_;
    fVar22 = auVar5._8_4_;
    fVar23 = auVar5._12_4_;
    auVar5 = ZEXT416((uint)((fVar15 * 12.0 + fVar14 * 6.0 + fVar13 * 4.0 + fVar11) * 0.16666667));
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    fVar24 = auVar5._0_4_;
    fVar25 = auVar5._4_4_;
    fVar26 = auVar5._8_4_;
    fVar27 = auVar5._12_4_;
    auVar5 = ZEXT416((uint)((fVar14 * 12.0 + fVar15 * 6.0 + fVar11 * 4.0 + fVar13) * 0.16666667));
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    fVar16 = auVar5._0_4_;
    fVar17 = auVar5._4_4_;
    fVar18 = auVar5._8_4_;
    fVar19 = auVar5._12_4_;
    auVar5 = vshufps_avx(ZEXT416((uint)(fVar11 * 0.16666667)),ZEXT416((uint)(fVar11 * 0.16666667)),0
                        );
    fVar31 = auVar5._0_4_;
    fVar28 = auVar5._4_4_;
    fVar29 = auVar5._8_4_;
    fVar30 = auVar5._12_4_;
    fVar15 = 1.0 - uu;
    fVar11 = fVar15 * fVar15 * fVar15;
    fVar13 = uu * uu * uu;
    fVar14 = fVar15 * uu * fVar15;
    fVar15 = fVar15 * uu * uu;
    auVar5 = vshufps_avx(ZEXT416((uint)(fVar13 * 0.16666667)),ZEXT416((uint)(fVar13 * 0.16666667)),0
                        );
    auVar3 = ZEXT416((uint)((fVar11 + fVar13 * 4.0 + fVar15 * 12.0 + fVar14 * 6.0) * 0.16666667));
    auVar3 = vshufps_avx(auVar3,auVar3,0);
    auVar12 = ZEXT416((uint)((fVar11 * 4.0 + fVar13 + fVar14 * 12.0 + fVar15 * 6.0) * 0.16666667));
    auVar12 = vshufps_avx(auVar12,auVar12,0);
    auVar4._0_4_ = auVar12._0_4_ *
                   (fVar31 * *(float *)(in_RSI + 0x50) +
                   fVar16 * *(float *)(in_RSI + 0x90) +
                   fVar24 * *(float *)(in_RSI + 0xd0) + fVar20 * *(float *)(in_RSI + 0x110)) +
                   (fVar31 * *(float *)(in_RSI + 0x60) +
                   fVar16 * *(float *)(in_RSI + 0xa0) +
                   fVar20 * *(float *)(in_RSI + 0x120) + fVar24 * *(float *)(in_RSI + 0xe0)) *
                   auVar3._0_4_ +
                   (fVar31 * *(float *)(in_RSI + 0x70) +
                   fVar16 * *(float *)(in_RSI + 0xb0) +
                   fVar20 * *(float *)(in_RSI + 0x130) + fVar24 * *(float *)(in_RSI + 0xf0)) *
                   auVar5._0_4_;
    auVar4._4_4_ = auVar12._4_4_ *
                   (fVar28 * *(float *)(in_RSI + 0x54) +
                   fVar17 * *(float *)(in_RSI + 0x94) +
                   fVar25 * *(float *)(in_RSI + 0xd4) + fVar21 * *(float *)(in_RSI + 0x114)) +
                   (fVar28 * *(float *)(in_RSI + 100) +
                   fVar17 * *(float *)(in_RSI + 0xa4) +
                   fVar21 * *(float *)(in_RSI + 0x124) + fVar25 * *(float *)(in_RSI + 0xe4)) *
                   auVar3._4_4_ +
                   (fVar28 * *(float *)(in_RSI + 0x74) +
                   fVar17 * *(float *)(in_RSI + 0xb4) +
                   fVar21 * *(float *)(in_RSI + 0x134) + fVar25 * *(float *)(in_RSI + 0xf4)) *
                   auVar5._4_4_;
    auVar4._8_4_ = auVar12._8_4_ *
                   (fVar29 * *(float *)(in_RSI + 0x58) +
                   fVar18 * *(float *)(in_RSI + 0x98) +
                   fVar26 * *(float *)(in_RSI + 0xd8) + fVar22 * *(float *)(in_RSI + 0x118)) +
                   (fVar29 * *(float *)(in_RSI + 0x68) +
                   fVar18 * *(float *)(in_RSI + 0xa8) +
                   fVar22 * *(float *)(in_RSI + 0x128) + fVar26 * *(float *)(in_RSI + 0xe8)) *
                   auVar3._8_4_ +
                   (fVar29 * *(float *)(in_RSI + 0x78) +
                   fVar18 * *(float *)(in_RSI + 0xb8) +
                   fVar22 * *(float *)(in_RSI + 0x138) + fVar26 * *(float *)(in_RSI + 0xf8)) *
                   auVar5._8_4_;
    auVar4._12_4_ =
         auVar12._12_4_ *
         (fVar30 * *(float *)(in_RSI + 0x5c) +
         fVar19 * *(float *)(in_RSI + 0x9c) +
         fVar27 * *(float *)(in_RSI + 0xdc) + fVar23 * *(float *)(in_RSI + 0x11c)) +
         (fVar30 * *(float *)(in_RSI + 0x6c) +
         fVar19 * *(float *)(in_RSI + 0xac) +
         fVar23 * *(float *)(in_RSI + 300) + fVar27 * *(float *)(in_RSI + 0xec)) * auVar3._12_4_ +
         (fVar30 * *(float *)(in_RSI + 0x7c) +
         fVar19 * *(float *)(in_RSI + 0xbc) +
         fVar23 * *(float *)(in_RSI + 0x13c) + fVar27 * *(float *)(in_RSI + 0xfc)) * auVar5._12_4_;
    auVar5 = vshufps_avx(ZEXT416((uint)(fVar11 * 0.16666667)),ZEXT416((uint)(fVar11 * 0.16666667)),0
                        );
    auVar9._0_4_ = auVar5._0_4_ *
                   (fVar31 * *(float *)(in_RSI + 0x40) +
                   fVar16 * *(float *)(in_RSI + 0x80) +
                   fVar24 * *(float *)(in_RSI + 0xc0) + fVar20 * *(float *)(in_RSI + 0x100));
    auVar9._4_4_ = auVar5._4_4_ *
                   (fVar28 * *(float *)(in_RSI + 0x44) +
                   fVar17 * *(float *)(in_RSI + 0x84) +
                   fVar25 * *(float *)(in_RSI + 0xc4) + fVar21 * *(float *)(in_RSI + 0x104));
    auVar9._8_4_ = auVar5._8_4_ *
                   (fVar29 * *(float *)(in_RSI + 0x48) +
                   fVar18 * *(float *)(in_RSI + 0x88) +
                   fVar26 * *(float *)(in_RSI + 200) + fVar22 * *(float *)(in_RSI + 0x108));
    auVar9._12_4_ =
         auVar5._12_4_ *
         (fVar30 * *(float *)(in_RSI + 0x4c) +
         fVar19 * *(float *)(in_RSI + 0x8c) +
         fVar27 * *(float *)(in_RSI + 0xcc) + fVar23 * *(float *)(in_RSI + 0x10c));
    break;
  case 2:
    fVar11 = 1.0 - uu;
    fVar13 = 1.0 - vv;
    auVar5 = ZEXT416((uint)(uu * uu * uu));
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    fVar17 = auVar5._0_4_;
    fVar18 = auVar5._4_4_;
    fVar19 = auVar5._8_4_;
    fVar20 = auVar5._12_4_;
    auVar5 = ZEXT416((uint)(uu * uu * 3.0 * fVar11));
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    fVar21 = auVar5._0_4_;
    fVar22 = auVar5._4_4_;
    fVar23 = auVar5._8_4_;
    fVar24 = auVar5._12_4_;
    auVar5 = ZEXT416((uint)(uu * 3.0 * fVar11 * fVar11));
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    fVar25 = auVar5._0_4_;
    fVar26 = auVar5._4_4_;
    fVar27 = auVar5._8_4_;
    fVar31 = auVar5._12_4_;
    auVar5 = ZEXT416((uint)(fVar11 * fVar11 * fVar11));
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    fVar11 = auVar5._0_4_;
    fVar14 = auVar5._4_4_;
    fVar15 = auVar5._8_4_;
    fVar16 = auVar5._12_4_;
    auVar5 = ZEXT416((uint)(vv * vv * vv));
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    auVar3 = ZEXT416((uint)(fVar13 * vv * vv * 3.0));
    auVar3 = vshufps_avx(auVar3,auVar3,0);
    auVar12 = ZEXT416((uint)(vv * 3.0 * fVar13 * fVar13));
    auVar12 = vshufps_avx(auVar12,auVar12,0);
    auVar8._0_4_ = auVar12._0_4_ *
                   (fVar11 * *(float *)(in_RSI + 0x80) +
                   fVar25 * *(float *)(in_RSI + 0x90) +
                   fVar21 * *(float *)(in_RSI + 0xa0) + fVar17 * *(float *)(in_RSI + 0xb0)) +
                   (fVar11 * *(float *)(in_RSI + 0xc0) +
                   fVar25 * *(float *)(in_RSI + 0xd0) +
                   fVar17 * *(float *)(in_RSI + 0xf0) + fVar21 * *(float *)(in_RSI + 0xe0)) *
                   auVar3._0_4_ +
                   auVar5._0_4_ *
                   (fVar11 * *(float *)(in_RSI + 0x100) +
                   fVar25 * *(float *)(in_RSI + 0x110) +
                   fVar21 * *(float *)(in_RSI + 0x120) + fVar17 * *(float *)(in_RSI + 0x130));
    auVar8._4_4_ = auVar12._4_4_ *
                   (fVar14 * *(float *)(in_RSI + 0x84) +
                   fVar26 * *(float *)(in_RSI + 0x94) +
                   fVar22 * *(float *)(in_RSI + 0xa4) + fVar18 * *(float *)(in_RSI + 0xb4)) +
                   (fVar14 * *(float *)(in_RSI + 0xc4) +
                   fVar26 * *(float *)(in_RSI + 0xd4) +
                   fVar18 * *(float *)(in_RSI + 0xf4) + fVar22 * *(float *)(in_RSI + 0xe4)) *
                   auVar3._4_4_ +
                   auVar5._4_4_ *
                   (fVar14 * *(float *)(in_RSI + 0x104) +
                   fVar26 * *(float *)(in_RSI + 0x114) +
                   fVar22 * *(float *)(in_RSI + 0x124) + fVar18 * *(float *)(in_RSI + 0x134));
    auVar8._8_4_ = auVar12._8_4_ *
                   (fVar15 * *(float *)(in_RSI + 0x88) +
                   fVar27 * *(float *)(in_RSI + 0x98) +
                   fVar23 * *(float *)(in_RSI + 0xa8) + fVar19 * *(float *)(in_RSI + 0xb8)) +
                   (fVar15 * *(float *)(in_RSI + 200) +
                   fVar27 * *(float *)(in_RSI + 0xd8) +
                   fVar19 * *(float *)(in_RSI + 0xf8) + fVar23 * *(float *)(in_RSI + 0xe8)) *
                   auVar3._8_4_ +
                   auVar5._8_4_ *
                   (fVar15 * *(float *)(in_RSI + 0x108) +
                   fVar27 * *(float *)(in_RSI + 0x118) +
                   fVar23 * *(float *)(in_RSI + 0x128) + fVar19 * *(float *)(in_RSI + 0x138));
    auVar8._12_4_ =
         auVar12._12_4_ *
         (fVar16 * *(float *)(in_RSI + 0x8c) +
         fVar31 * *(float *)(in_RSI + 0x9c) +
         fVar24 * *(float *)(in_RSI + 0xac) + fVar20 * *(float *)(in_RSI + 0xbc)) +
         (fVar16 * *(float *)(in_RSI + 0xcc) +
         fVar31 * *(float *)(in_RSI + 0xdc) +
         fVar20 * *(float *)(in_RSI + 0xfc) + fVar24 * *(float *)(in_RSI + 0xec)) * auVar3._12_4_ +
         auVar5._12_4_ *
         (fVar16 * *(float *)(in_RSI + 0x10c) +
         fVar31 * *(float *)(in_RSI + 0x11c) +
         fVar24 * *(float *)(in_RSI + 300) + fVar20 * *(float *)(in_RSI + 0x13c));
    auVar5 = ZEXT416((uint)(fVar13 * fVar13 * fVar13));
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    auVar3._0_4_ = auVar5._0_4_ *
                   (fVar11 * *(float *)(in_RSI + 0x40) +
                   fVar25 * *(float *)(in_RSI + 0x50) +
                   fVar21 * *(float *)(in_RSI + 0x60) + fVar17 * *(float *)(in_RSI + 0x70));
    auVar3._4_4_ = auVar5._4_4_ *
                   (fVar14 * *(float *)(in_RSI + 0x44) +
                   fVar26 * *(float *)(in_RSI + 0x54) +
                   fVar22 * *(float *)(in_RSI + 100) + fVar18 * *(float *)(in_RSI + 0x74));
    auVar3._8_4_ = auVar5._8_4_ *
                   (fVar15 * *(float *)(in_RSI + 0x48) +
                   fVar27 * *(float *)(in_RSI + 0x58) +
                   fVar23 * *(float *)(in_RSI + 0x68) + fVar19 * *(float *)(in_RSI + 0x78));
    auVar3._12_4_ =
         auVar5._12_4_ *
         (fVar16 * *(float *)(in_RSI + 0x4c) +
         fVar31 * *(float *)(in_RSI + 0x5c) +
         fVar24 * *(float *)(in_RSI + 0x6c) + fVar20 * *(float *)(in_RSI + 0x7c));
    goto LAB_00e9e3a6;
  case 3:
    auVar12 = vshufps_avx(auVar5,auVar3,0);
    auVar12 = vcmpps_avx(auVar12,_DAT_01fb4ad0,0);
    if ((((auVar12 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar12 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar12 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar12[0xf]) {
      auVar12 = vinsertps_avx(ZEXT416(*(uint *)(in_RSI + 0x10c)),ZEXT416(*(uint *)(in_RSI + 0x11c)),
                              0x1c);
      auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(in_RSI + 300)),0x28);
      auVar4 = vinsertps_avx(ZEXT416(*(uint *)(in_RSI + 0xcc)),ZEXT416(*(uint *)(in_RSI + 0xdc)),
                             0x1c);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(in_RSI + 0xec)),0x28);
      auVar9 = vinsertps_avx(ZEXT416(*(uint *)(in_RSI + 0x8c)),ZEXT416(*(uint *)(in_RSI + 0x9c)),
                             0x1c);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(in_RSI + 0xac)),0x28);
      auVar8 = vinsertps_avx(ZEXT416(*(uint *)(in_RSI + 0x4c)),ZEXT416(*(uint *)(in_RSI + 0x5c)),
                             0x1c);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(in_RSI + 0x6c)),0x28);
      auVar1 = vshufps_avx(auVar5,auVar5,0);
      auVar3 = vshufps_avx(auVar3,auVar3,0);
      fVar11 = uu + vv;
      auVar5 = vrcpss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
      auVar5 = ZEXT416((uint)(auVar5._0_4_ * (2.0 - auVar5._0_4_ * fVar11)));
      auVar5 = vshufps_avx(auVar5,auVar5,0);
      fVar11 = (auVar1._0_4_ * *(float *)(in_RSI + 0x90) + auVar3._0_4_ * auVar8._0_4_) *
               auVar5._0_4_;
      fVar13 = (auVar1._4_4_ * *(float *)(in_RSI + 0x94) + auVar3._4_4_ * auVar8._4_4_) *
               auVar5._4_4_;
      fVar14 = (auVar1._8_4_ * *(float *)(in_RSI + 0x98) + auVar3._8_4_ * auVar8._8_4_) *
               auVar5._8_4_;
      fVar15 = (auVar1._12_4_ * *(float *)(in_RSI + 0x9c) + auVar3._12_4_ * auVar8._12_4_) *
               auVar5._12_4_;
      fVar16 = 1.0 - uu;
      auVar8 = vshufps_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16),0);
      fVar16 = fVar16 + vv;
      auVar5 = vrcpss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
      auVar5 = ZEXT416((uint)(auVar5._0_4_ * (2.0 - auVar5._0_4_ * fVar16)));
      auVar5 = vshufps_avx(auVar5,auVar5,0);
      fVar16 = (auVar8._0_4_ * auVar9._0_4_ + auVar3._0_4_ * *(float *)(in_RSI + 0xa0)) *
               auVar5._0_4_;
      fVar17 = (auVar8._4_4_ * auVar9._4_4_ + auVar3._4_4_ * *(float *)(in_RSI + 0xa4)) *
               auVar5._4_4_;
      fVar18 = (auVar8._8_4_ * auVar9._8_4_ + auVar3._8_4_ * *(float *)(in_RSI + 0xa8)) *
               auVar5._8_4_;
      fVar19 = (auVar8._12_4_ * auVar9._12_4_ + auVar3._12_4_ * *(float *)(in_RSI + 0xac)) *
               auVar5._12_4_;
      auVar3 = vshufps_avx(ZEXT416((uint)(1.0 - vv)),ZEXT416((uint)(1.0 - vv)),0);
      fVar20 = (2.0 - uu) - vv;
      auVar5 = vrcpss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
      auVar5 = ZEXT416((uint)(auVar5._0_4_ * (2.0 - fVar20 * auVar5._0_4_)));
      auVar5 = vshufps_avx(auVar5,auVar5,0);
      fVar20 = auVar5._0_4_ *
               (auVar8._0_4_ * *(float *)(in_RSI + 0xe0) + auVar3._0_4_ * auVar4._0_4_);
      fVar21 = auVar5._4_4_ *
               (auVar8._4_4_ * *(float *)(in_RSI + 0xe4) + auVar3._4_4_ * auVar4._4_4_);
      fVar22 = auVar5._8_4_ *
               (auVar8._8_4_ * *(float *)(in_RSI + 0xe8) + auVar3._8_4_ * auVar4._8_4_);
      fVar23 = auVar5._12_4_ *
               (auVar8._12_4_ * *(float *)(in_RSI + 0xec) + auVar3._12_4_ * auVar4._12_4_);
      fVar24 = (uu + 1.0) - vv;
      auVar5 = vrcpss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
      auVar5 = ZEXT416((uint)(auVar5._0_4_ * (2.0 - fVar24 * auVar5._0_4_)));
      auVar5 = vshufps_avx(auVar5,auVar5,0);
      fVar24 = auVar5._0_4_ *
               (auVar3._0_4_ * *(float *)(in_RSI + 0xd0) + auVar1._0_4_ * auVar12._0_4_);
      fVar25 = auVar5._4_4_ *
               (auVar3._4_4_ * *(float *)(in_RSI + 0xd4) + auVar1._4_4_ * auVar12._4_4_);
      fVar26 = auVar5._8_4_ *
               (auVar3._8_4_ * *(float *)(in_RSI + 0xd8) + auVar1._8_4_ * auVar12._8_4_);
      fVar27 = auVar5._12_4_ *
               (auVar3._12_4_ * *(float *)(in_RSI + 0xdc) + auVar1._12_4_ * auVar12._12_4_);
    }
    else {
      fVar11 = *(float *)(in_RSI + 0x90);
      fVar13 = *(float *)(in_RSI + 0x94);
      fVar14 = *(float *)(in_RSI + 0x98);
      fVar15 = *(float *)(in_RSI + 0x9c);
      fVar16 = *(float *)(in_RSI + 0xa0);
      fVar17 = *(float *)(in_RSI + 0xa4);
      fVar18 = *(float *)(in_RSI + 0xa8);
      fVar19 = *(float *)(in_RSI + 0xac);
      fVar24 = *(float *)(in_RSI + 0xd0);
      fVar25 = *(float *)(in_RSI + 0xd4);
      fVar26 = *(float *)(in_RSI + 0xd8);
      fVar27 = *(float *)(in_RSI + 0xdc);
      fVar20 = *(float *)(in_RSI + 0xe0);
      fVar21 = *(float *)(in_RSI + 0xe4);
      fVar22 = *(float *)(in_RSI + 0xe8);
      fVar23 = *(float *)(in_RSI + 0xec);
    }
    fVar31 = 1.0 - vv;
    fVar28 = 1.0 - uu;
    auVar5 = ZEXT416((uint)(uu * uu * uu));
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    fVar33 = auVar5._0_4_;
    fVar34 = auVar5._4_4_;
    fVar35 = auVar5._8_4_;
    fVar36 = auVar5._12_4_;
    auVar5 = ZEXT416((uint)(uu * uu * 3.0 * fVar28));
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    fVar37 = auVar5._0_4_;
    fVar38 = auVar5._4_4_;
    fVar39 = auVar5._8_4_;
    fVar40 = auVar5._12_4_;
    auVar5 = ZEXT416((uint)(uu * 3.0 * fVar28 * fVar28));
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    fVar41 = auVar5._0_4_;
    fVar42 = auVar5._4_4_;
    fVar43 = auVar5._8_4_;
    fVar44 = auVar5._12_4_;
    auVar5 = ZEXT416((uint)(fVar28 * fVar28 * fVar28));
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    fVar28 = auVar5._0_4_;
    fVar29 = auVar5._4_4_;
    fVar30 = auVar5._8_4_;
    fVar32 = auVar5._12_4_;
    auVar5 = ZEXT416((uint)(vv * vv * vv));
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    auVar3 = ZEXT416((uint)(vv * vv * 3.0 * fVar31));
    auVar3 = vshufps_avx(auVar3,auVar3,0);
    auVar12 = ZEXT416((uint)(vv * 3.0 * fVar31 * fVar31));
    auVar12 = vshufps_avx(auVar12,auVar12,0);
    auVar8._0_4_ = auVar12._0_4_ *
                   (fVar28 * *(float *)(in_RSI + 0x80) +
                   fVar41 * fVar11 + fVar33 * *(float *)(in_RSI + 0xb0) + fVar37 * fVar16) +
                   auVar3._0_4_ *
                   (fVar28 * *(float *)(in_RSI + 0xc0) +
                   fVar41 * fVar24 + fVar37 * fVar20 + fVar33 * *(float *)(in_RSI + 0xf0)) +
                   auVar5._0_4_ *
                   (fVar28 * *(float *)(in_RSI + 0x100) +
                   fVar41 * *(float *)(in_RSI + 0x110) +
                   fVar33 * *(float *)(in_RSI + 0x130) + fVar37 * *(float *)(in_RSI + 0x120));
    auVar8._4_4_ = auVar12._4_4_ *
                   (fVar29 * *(float *)(in_RSI + 0x84) +
                   fVar42 * fVar13 + fVar34 * *(float *)(in_RSI + 0xb4) + fVar38 * fVar17) +
                   auVar3._4_4_ *
                   (fVar29 * *(float *)(in_RSI + 0xc4) +
                   fVar42 * fVar25 + fVar38 * fVar21 + fVar34 * *(float *)(in_RSI + 0xf4)) +
                   auVar5._4_4_ *
                   (fVar29 * *(float *)(in_RSI + 0x104) +
                   fVar42 * *(float *)(in_RSI + 0x114) +
                   fVar34 * *(float *)(in_RSI + 0x134) + fVar38 * *(float *)(in_RSI + 0x124));
    auVar8._8_4_ = auVar12._8_4_ *
                   (fVar30 * *(float *)(in_RSI + 0x88) +
                   fVar43 * fVar14 + fVar35 * *(float *)(in_RSI + 0xb8) + fVar39 * fVar18) +
                   auVar3._8_4_ *
                   (fVar30 * *(float *)(in_RSI + 200) +
                   fVar43 * fVar26 + fVar39 * fVar22 + fVar35 * *(float *)(in_RSI + 0xf8)) +
                   auVar5._8_4_ *
                   (fVar30 * *(float *)(in_RSI + 0x108) +
                   fVar43 * *(float *)(in_RSI + 0x118) +
                   fVar35 * *(float *)(in_RSI + 0x138) + fVar39 * *(float *)(in_RSI + 0x128));
    auVar8._12_4_ =
         auVar12._12_4_ *
         (fVar32 * *(float *)(in_RSI + 0x8c) +
         fVar44 * fVar15 + fVar36 * *(float *)(in_RSI + 0xbc) + fVar40 * fVar19) +
         auVar3._12_4_ *
         (fVar32 * *(float *)(in_RSI + 0xcc) +
         fVar44 * fVar27 + fVar40 * fVar23 + fVar36 * *(float *)(in_RSI + 0xfc)) +
         auVar5._12_4_ *
         (fVar32 * *(float *)(in_RSI + 0x10c) +
         fVar44 * *(float *)(in_RSI + 0x11c) +
         fVar36 * *(float *)(in_RSI + 0x13c) + fVar40 * *(float *)(in_RSI + 300));
    auVar5 = ZEXT416((uint)(fVar31 * fVar31 * fVar31));
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    auVar3._0_4_ = (fVar28 * *(float *)(in_RSI + 0x40) +
                   fVar41 * *(float *)(in_RSI + 0x50) +
                   fVar33 * *(float *)(in_RSI + 0x70) + fVar37 * *(float *)(in_RSI + 0x60)) *
                   auVar5._0_4_;
    auVar3._4_4_ = (fVar29 * *(float *)(in_RSI + 0x44) +
                   fVar42 * *(float *)(in_RSI + 0x54) +
                   fVar34 * *(float *)(in_RSI + 0x74) + fVar38 * *(float *)(in_RSI + 100)) *
                   auVar5._4_4_;
    auVar3._8_4_ = (fVar30 * *(float *)(in_RSI + 0x48) +
                   fVar43 * *(float *)(in_RSI + 0x58) +
                   fVar35 * *(float *)(in_RSI + 0x78) + fVar39 * *(float *)(in_RSI + 0x68)) *
                   auVar5._8_4_;
    auVar3._12_4_ =
         (fVar32 * *(float *)(in_RSI + 0x4c) +
         fVar44 * *(float *)(in_RSI + 0x5c) +
         fVar36 * *(float *)(in_RSI + 0x7c) + fVar40 * *(float *)(in_RSI + 0x6c)) * auVar5._12_4_;
LAB_00e9e3a6:
    uVar7 = auVar8._0_8_;
    uVar2 = auVar3._0_8_;
    fVar11 = auVar3._0_4_ + auVar8._0_4_;
    fVar13 = auVar3._4_4_ + auVar8._4_4_;
    fVar14 = auVar3._8_4_ + auVar8._8_4_;
    fVar15 = auVar3._12_4_ + auVar8._12_4_;
  default:
    goto switchD_00e9e264_caseD_4;
  case 6:
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    auVar12 = vshufps_avx(ZEXT416((uint)(1.0 - uu)),ZEXT416((uint)(1.0 - uu)),0);
    auVar3 = vshufps_avx(auVar3,auVar3,0);
    auVar4._0_4_ = auVar3._0_4_ *
                   (auVar5._0_4_ * *(float *)(in_RSI + 0x60) +
                   auVar12._0_4_ * *(float *)(in_RSI + 0x70));
    auVar4._4_4_ = auVar3._4_4_ *
                   (auVar5._4_4_ * *(float *)(in_RSI + 100) +
                   auVar12._4_4_ * *(float *)(in_RSI + 0x74));
    auVar4._8_4_ = auVar3._8_4_ *
                   (auVar5._8_4_ * *(float *)(in_RSI + 0x68) +
                   auVar12._8_4_ * *(float *)(in_RSI + 0x78));
    auVar4._12_4_ =
         auVar3._12_4_ *
         (auVar5._12_4_ * *(float *)(in_RSI + 0x6c) + auVar12._12_4_ * *(float *)(in_RSI + 0x7c));
    auVar3 = vshufps_avx(ZEXT416((uint)(1.0 - vv)),ZEXT416((uint)(1.0 - vv)),0);
    auVar9._0_4_ = auVar3._0_4_ *
                   (auVar5._0_4_ * *(float *)(in_RSI + 0x50) +
                   auVar12._0_4_ * *(float *)(in_RSI + 0x40));
    auVar9._4_4_ = auVar3._4_4_ *
                   (auVar5._4_4_ * *(float *)(in_RSI + 0x54) +
                   auVar12._4_4_ * *(float *)(in_RSI + 0x44));
    auVar9._8_4_ = auVar3._8_4_ *
                   (auVar5._8_4_ * *(float *)(in_RSI + 0x58) +
                   auVar12._8_4_ * *(float *)(in_RSI + 0x48));
    auVar9._12_4_ =
         auVar3._12_4_ *
         (auVar5._12_4_ * *(float *)(in_RSI + 0x5c) + auVar12._12_4_ * *(float *)(in_RSI + 0x4c));
  }
  uVar7 = auVar9._0_8_;
  uVar2 = auVar4._0_8_;
  fVar11 = auVar9._0_4_ + auVar4._0_4_;
  fVar13 = auVar9._4_4_ + auVar4._4_4_;
  fVar14 = auVar9._8_4_ + auVar4._8_4_;
  fVar15 = auVar9._12_4_ + auVar4._12_4_;
switchD_00e9e264_caseD_4:
  *(float *)&(patch->root_ref).data.super_atomic<long>.super___atomic_base<long>._M_i = fVar11;
  *(float *)((long)&(patch->root_ref).data.super_atomic<long>.super___atomic_base<long>._M_i + 4) =
       fVar13;
  *(float *)&patch->mtx = fVar14;
  *(float *)(patch->u + 1) = fVar15;
  VVar45.field_0._8_8_ = uVar7;
  VVar45.field_0._0_8_ = uVar2;
  return (Vec3fa)VVar45.field_0;
}

Assistant:

Vec3fa patchEval(const SubdivPatch1Base& patch, const float uu, const float vv) 
    {
      if (likely(patch.type == SubdivPatch1Base::BEZIER_PATCH))
        return ((BezierPatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::BSPLINE_PATCH))
        return ((BSplinePatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::GREGORY_PATCH))
        return ((DenseGregoryPatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::BILINEAR_PATCH))
        return ((BilinearPatch3fa*)patch.patch_v)->eval(uu,vv);
      return Vec3fa( zero );
    }